

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::
Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*,axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>>
::
setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>::ZeroConstruct>
          (Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*,axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>>
           *this,size_t count)

{
  size_t __n;
  long lVar1;
  ulong uVar2;
  BufHdr *pBVar3;
  size_t sVar4;
  BufHdr *pBVar5;
  bool bVar6;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  __n = count * 8;
  lVar1 = *(long *)(this + 8);
  if ((lVar1 != 0) && (*(int *)(lVar1 + 0x10) == 1)) {
    uVar2 = *(ulong *)(this + 0x10);
    if (count == uVar2) {
      return true;
    }
    if (__n <= *(ulong *)(lVar1 + 0x18)) {
      if (uVar2 <= count && count - uVar2 != 0) {
        memset((void *)(uVar2 * 8 + *(long *)this),0,(count - uVar2) * 8);
      }
      *(size_t *)(this + 0x10) = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
    ::release((ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
               *)this);
  }
  else {
    if (*(long *)(this + 0x10) != 0) {
      sVar4 = getAllocSize<4096ul>(__n);
      pBVar5 = (BufHdr *)mem::allocate(sVar4 + 0x28);
      (pBVar5->super_RefCount).m_refCount = 0;
      (pBVar5->super_RefCount).m_weakRefCount = 1;
      (pBVar5->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198a88;
      pBVar5->m_bufferSize = sVar4;
      pBVar5->m_flags = 0;
      (pBVar5->super_RefCount).m_freeFunc = mem::deallocate;
      rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar5);
      bVar6 = local_38.m_p != (BufHdr *)0x0;
      if (bVar6) {
        pBVar5 = local_38.m_p + 1;
        if (*(ulong *)(this + 0x10) < count) {
          __wrap_memcpy(pBVar5,*(void **)this,*(ulong *)(this + 0x10) << 3);
          memset(&(pBVar5->super_RefCount)._vptr_RefCount + *(long *)(this + 0x10),0,
                 (count - *(long *)(this + 0x10)) * 8);
        }
        else {
          __wrap_memcpy(pBVar5,*(void **)this,__n);
        }
        rc::RefCount::release(*(RefCount **)(this + 8));
        pBVar3 = local_38.m_p;
        *(BufHdr **)this = pBVar5;
        local_38.m_p = (BufHdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        *(BufHdr **)(this + 8) = pBVar3;
        *(size_t *)(this + 0x10) = count;
      }
      rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
      return bVar6;
    }
    bVar6 = Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
            ::reserve((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                       *)this,count);
    if (!bVar6) {
      return false;
    }
    memset(*(void **)this,0,__n);
    *(size_t *)(this + 0x10) = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}